

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avi_rw.cpp
# Opt level: O2

void read_rec(FILE *file,uint32_t bytes,AVIMaker *aviMaker)

{
  bool bVar1;
  uint32_t node;
  Chunk chunk;
  uint32_t local_34;
  Chunk local_30;
  
  local_30.ckID = 0;
  local_30.ckSize = 0;
  local_34 = bytes;
  while (local_34 != 0) {
    node = read_node(file,&local_34);
    bVar1 = read_data(file,node,&local_34,aviMaker);
    if ((!bVar1) && ((node == 0x4b4e554a || (node == 0x74646576)))) {
      read_chunk(file,&local_30,node,&local_34);
      skip(file,local_30.ckSize,&local_34);
    }
  }
  return;
}

Assistant:

void read_rec(FILE *file, uint32_t bytes, AVIMaker *aviMaker) {
    uint32_t node;
    Chunk chunk;
    while (bytes > 0) {
        node = read_node(file, bytes);
        if (read_data(file, node, bytes, aviMaker)) continue;
        switch (node) {
            case VEDT:
                //bytes -= CHUNK_SIZE;
                read_chunk(file, chunk, node, bytes);
                //TRACE print_chunk(chunk);
                skip(file, chunk.ckSize, bytes);
                //bytes -= chunk.ckSize;
                break;
            case JUNK:
                //bytes -= CHUNK_SIZE;
                read_chunk(file, chunk, node, bytes);
                //TRACE print_chunk(chunk);
                skip(file, chunk.ckSize, bytes);
                //bytes -= chunk.ckSize;
                break;
            default:
                int x;
                //std::cin >> x;
                //TRACE printf("unknow fourcc rec - ");
                //TRACE print_fourcc(node);
                //TRACE printf("- 0x%x\n", node);
                break;
        };
        //printf("bytes: %d\n", bytes);
        //std::cin >> x;
    }
}